

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_lambda.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseLambda(Parser *this)

{
  Lexer *pLVar1;
  bool bVar2;
  bool bVar3;
  Token *pTVar4;
  type pEVar5;
  size_t sVar6;
  pointer pEVar7;
  pointer this_00;
  Position *pPVar8;
  Parser *in_RSI;
  undefined1 local_150 [14];
  undefined2 local_142;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_140;
  undefined1 local_138 [8];
  undefined1 local_130 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> body;
  undefined4 local_10c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_108;
  _Base_ptr local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [16];
  Position pos;
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  pointer local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [24];
  __normal_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_58;
  const_iterator local_50;
  size_t local_48;
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> paramexpr;
  Exprs params;
  bool err;
  Parser *this_local;
  
  sanityExpect(in_RSI,TOK_KW_LAMBDA);
  bVar2 = false;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)&paramexpr);
  pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
  bVar3 = Token::operator==(pTVar4,TOK_OP_BRACKET_OPEN);
  if (bVar3) {
    Lexer::next(in_RSI->lexer);
    parseExpression((Parser *)&biopexpr,(Precedence)in_RSI);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&biopexpr);
    if (bVar3) {
      while( true ) {
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &biopexpr);
        bVar3 = isBiOpExpr(pEVar5,TOK_OP_COMMA);
        if (!bVar3) break;
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &biopexpr);
        sVar6 = __dynamic_cast(pEVar5,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
        if (sVar6 == 0) {
          __cxa_bad_cast();
        }
        local_48 = sVar6;
        local_58._M_current =
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
             std::
             vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::begin((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                      *)&paramexpr);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
        ::__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>*>
                  ((__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                    *)&local_50,&local_58);
        BiOpExpr::getRightPtr((BiOpExpr *)(local_70 + 0x10));
        local_70._8_8_ =
             std::
             vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::insert((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       *)&paramexpr,local_50,(value_type *)(local_70 + 0x10));
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   (local_70 + 0x10));
        BiOpExpr::getLeftPtr((BiOpExpr *)local_70);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_70);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_70);
      }
      local_80._0_8_ =
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&paramexpr);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
      ::__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>*>
                ((__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  *)(local_80 + 8),
                 (__normal_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                  *)local_80);
      local_88 = (pointer)std::
                          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                          ::insert((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                    *)&paramexpr,(const_iterator)local_80._8_8_,
                                   (value_type *)&biopexpr);
    }
    else {
      bVar2 = true;
    }
    bVar3 = expect(in_RSI,TOK_BRACKET_CLOSE);
    if (!bVar3) {
      expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ = 2;
      expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._0_4_ = 1;
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar4);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&stack0xffffffffffffff68,
                 (SyntaxErrorCode *)
                 ((long)&expr._M_t.
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6),
                 (Position *)&expr);
      generateError((Parser *)&stack0xffffffffffffff70,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffff70);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&stack0xffffffffffffff68);
      bVar2 = true;
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr);
  }
  pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
  bVar3 = Token::operator==(pTVar4,TOK_OP_ASG);
  if (bVar3) {
    Lexer::next(in_RSI->lexer);
    parseExpression((Parser *)local_a8,(Precedence)in_RSI);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_a8);
    if (bVar3) {
      if (bVar2) {
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      else {
        pEVar7 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_a8);
        pPVar8 = Expr::getPosition(pEVar7);
        Position::Position((Position *)(local_e8 + 8),pPVar8);
        pLVar1 = in_RSI->lexer;
        pEVar7 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_a8);
        pPVar8 = Expr::getPosition(pEVar7);
        local_108._M_allocated_capacity = 0;
        local_108._8_8_ = 0;
        local_f8 = (_Base_ptr)0x0;
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)&local_108);
        local_10c = 1;
        std::
        make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position_const&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType>
                  ((Lexer *)local_f0,(Position *)pLVar1,
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)pPVar8,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   &local_108._M_allocated_capacity,(ReturnControlType *)local_a8);
        std::
        make_unique<pfederc::LambdaExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                  ((Lexer *)local_e8,(Position *)pLVar1,
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)(local_e8 + 8),
                   (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                   &paramexpr);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::LambdaExpr,std::default_delete<pfederc::LambdaExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
                   local_e8);
        std::unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
                   local_e8);
        std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                   local_f0);
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   *)&local_108);
      }
    }
    else {
      local_c0._6_2_ = 2;
      local_c0._0_4_ = 0x13;
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar4);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_c0 + 8),(SyntaxErrorCode *)(local_c0 + 6),(Position *)local_c0);
      generateError((Parser *)local_b0,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_b0);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_c0 + 8));
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
    pos.endIndex._4_4_ = 1;
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_a8);
  }
  else {
    bVar3 = expect(in_RSI,TOK_EOL);
    if (!bVar3) {
      body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
      _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._6_2_ = 2;
      body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
      _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0xf;
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar4);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&stack0xfffffffffffffee0,
                 (SyntaxErrorCode *)
                 ((long)&body._M_t.
                         super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                         .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 6),
                 (Position *)&body);
      generateError((Parser *)&stack0xfffffffffffffee8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xfffffffffffffee8);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&stack0xfffffffffffffee0);
      bVar2 = true;
    }
    parseFunctionBody((Parser *)local_130);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_130);
    if (!bVar3) {
      bVar2 = true;
    }
    bVar3 = expect(in_RSI,TOK_STMT);
    if (!bVar3) {
      local_142 = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
      local_150._8_4_ = 0xc;
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar4);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_140,(SyntaxErrorCode *)&local_142,(Position *)(local_150 + 8));
      generateError((Parser *)local_138,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_138);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr(&local_140);
      bVar2 = true;
    }
    if (bVar2) {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
    else {
      pLVar1 = in_RSI->lexer;
      this_00 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::
                operator->((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *
                           )local_130);
      pPVar8 = Expr::getPosition(&this_00->super_Expr);
      std::
      make_unique<pfederc::LambdaExpr,pfederc::Lexer&,pfederc::Position_const&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                ((Lexer *)local_150,(Position *)pLVar1,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)pPVar8,
                 (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                 &paramexpr);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::LambdaExpr,std::default_delete<pfederc::LambdaExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
                 local_150);
      std::unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
                 local_150);
    }
    pos.endIndex._4_4_ = 1;
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_130);
  }
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             *)&paramexpr);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseLambda() noexcept {
  sanityExpect(TokenType::TOK_KW_LAMBDA);

  bool err = false;

  Exprs params;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    lexer.next();

    std::unique_ptr<Expr> paramexpr(parseExpression());
    if (!paramexpr) {
      err = true;
    } else {
      while (isBiOpExpr(*paramexpr, TokenType::TOK_OP_COMMA)) {
        BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*paramexpr);
        params.insert(params.begin(), biopexpr.getRightPtr());
        paramexpr = biopexpr.getLeftPtr();
      }

      params.insert(params.begin(), std::move(paramexpr));
    }

    if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET, lexer.getCurrentToken()->getPosition()));
      err = true;
    }
  }

  if (*lexer.getCurrentToken() == TokenType::TOK_OP_ASG) {
    // *=* *expr*
    lexer.next(); // eat =

    std::unique_ptr<Expr> expr(parseExpression());
    if (!expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EXPR, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    if (err)
      return nullptr;

    Position pos(expr->getPosition());

    return std::make_unique<LambdaExpr>(lexer, pos,
      std::move(params), std::make_unique<BodyExpr>(lexer,
        expr->getPosition(),
        Exprs(), std::move(expr), ReturnControlType::RETURN));
  }
  // *newline* *body* *;*
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  std::unique_ptr<BodyExpr> body(parseFunctionBody());
  if (!body)
    err = true;

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return nullptr;

  return std::make_unique<LambdaExpr>(lexer, body->getPosition(),
    std::move(params), std::move(body));
}